

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.hpp
# Opt level: O2

void __thiscall helics::CallbackFederate::clearNextTimeCallback(CallbackFederate *this)

{
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::operator=((function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
               *)&(this->super_CombinationFederate).super_ValueFederate.field_0x58,(nullptr_t)0x0);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::operator=((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
               *)&(this->super_CombinationFederate).super_ValueFederate.field_0x78,(nullptr_t)0x0);
  return;
}

Assistant:

void clearNextTimeCallback()
    {
        nextTimeOperation1 = nullptr;
        nextTimeOperation2 = nullptr;
    }